

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

GCObject ** sweeplist(lua_State *L,GCObject **p,lu_mem count)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  GCObject **in_RDX;
  GCObject *in_RSI;
  long in_RDI;
  int deadmask;
  global_State *g;
  GCObject *curr;
  GCObject *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  GCObject *count_00;
  
  lVar1 = *(long *)(in_RDI + 0x20);
  uVar3 = *(byte *)(lVar1 + 0x20) ^ 3;
  while( true ) {
    count_00 = (in_RSI->gch).next;
    uVar2 = in_stack_ffffffffffffffd0 & 0xffffff;
    if (count_00 != (GCObject *)0x0) {
      uVar2 = CONCAT13(in_RDX != (GCObject **)0x0,(int3)in_stack_ffffffffffffffd0);
      in_RDX = (GCObject **)((long)in_RDX + -1);
    }
    in_stack_ffffffffffffffd0 = uVar2;
    if ((char)(in_stack_ffffffffffffffd0 >> 0x18) == '\0') break;
    if ((count_00->gch).tt == '\b') {
      sweeplist((lua_State *)in_RSI,in_RDX,(lu_mem)count_00);
    }
    if ((((count_00->gch).marked ^ 3) & uVar3) == 0) {
      (in_RSI->gch).next = (count_00->gch).next;
      if (count_00 == *(GCObject **)(lVar1 + 0x28)) {
        *(GCObject **)(lVar1 + 0x28) = (count_00->gch).next;
      }
      freeobj((lua_State *)CONCAT44(uVar3,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
    }
    else {
      (count_00->gch).marked = (count_00->gch).marked & 0xf8 | *(byte *)(lVar1 + 0x20) & 3;
      in_RSI = count_00;
    }
  }
  return &((lua_State *)in_RSI)->next;
}

Assistant:

static GCObject**sweeplist(lua_State*L,GCObject**p,lu_mem count){
GCObject*curr;
global_State*g=G(L);
int deadmask=otherwhite(g);
while((curr=*p)!=NULL&&count-->0){
if(curr->gch.tt==8)
sweepwholelist(L,&gco2th(curr)->openupval);
if((curr->gch.marked^bit2mask(0,1))&deadmask){
makewhite(g,curr);
p=&curr->gch.next;
}
else{
*p=curr->gch.next;
if(curr==g->rootgc)
g->rootgc=curr->gch.next;
freeobj(L,curr);
}
}
return p;
}